

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  uchar *z;
  int in_stack_ffffffffffffffcc;
  uchar *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = sqlite3_value_text((sqlite3_value *)0x223cc1);
  if ((local_10 != (uchar *)0x0) && (*local_10 != '\0')) {
    sqlite3Utf8Read(&local_10);
    sqlite3_result_int(in_RDI,in_stack_ffffffffffffffcc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}